

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O0

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  undefined1 auVar1 [16];
  long i_00;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this_00;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  __jmp_buf_tag *__env;
  long *plVar8;
  int *piVar9;
  int in_ECX;
  char *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  store_t_conflict1 v_1;
  int d_2;
  long i_2;
  int j_2;
  long k_2;
  int d_1;
  long i_1;
  long j;
  store_t_conflict1 v;
  int d;
  int ii;
  long i;
  long j_1;
  int jj;
  long kk;
  long k_1;
  int rk;
  valarray<int> nline;
  valarray<int> vline;
  int k;
  int rn;
  int bits;
  int color;
  int depth;
  long height;
  long width;
  uchar **row;
  uchar *img;
  png_infop end;
  png_infop info;
  png_structp png;
  FILE *in;
  int *in_stack_fffffffffffffb58;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  valarray<int> *in_stack_fffffffffffffb70;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb98;
  long k_00;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  int j_00;
  long in_stack_fffffffffffffba8;
  long in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffbc0;
  store_t_conflict1 local_356;
  int local_354;
  long local_350;
  int local_344;
  long local_340;
  int local_334;
  long local_330 [3];
  long local_318 [3];
  ushort local_2fa;
  int local_2f8;
  int local_2f4;
  long local_2f0 [3];
  long local_2d8 [3];
  long local_2c0;
  int local_2b4;
  long local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  long local_2a0 [3];
  long local_288 [2];
  int local_278;
  undefined4 local_274;
  valarray<int> local_270;
  undefined4 local_25c;
  valarray<int> local_258;
  int local_244;
  int local_240;
  uint local_23c;
  uint local_238;
  int local_234;
  ulong local_230;
  ulong local_228;
  undefined1 local_21a;
  allocator local_219;
  string local_218 [96];
  void *local_1b8;
  void *local_1b0;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  long local_180;
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  long local_150;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  long local_120;
  undefined1 local_112;
  allocator local_111;
  string local_110 [96];
  FILE *local_b0;
  undefined1 local_a5;
  allocator local_91;
  string local_90 [96];
  long local_30;
  long local_28;
  int local_1c;
  char *local_18;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar6 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,1);
  if ((uVar6 & 1) == 0) {
    local_a5 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,local_18,&local_91);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (char *)in_stack_fffffffffffffb60);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    local_a5 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_b0 = fopen(local_18,"rb");
  if (local_b0 == (FILE *)0x0) {
    local_112 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,local_18,&local_111);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (char *)in_stack_fffffffffffffb60);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    local_112 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_120 = png_create_read_struct("1.6.37",0,0);
  if (local_120 == 0) {
    fclose(local_b0);
    local_142 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,"Cannot allocate handle for reading PNG files",&local_141);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    local_142 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_150 = png_create_info_struct(local_120);
  if (local_150 == 0) {
    png_destroy_read_struct(&local_120,0);
    fclose(local_b0);
    local_172 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"Cannot allocate PNG info structure",&local_171);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    local_172 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_180 = png_create_info_struct(local_120);
  if (local_180 == 0) {
    png_destroy_read_struct(&local_120,&local_150,0);
    fclose(local_b0);
    local_1a2 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Cannot allocate PNG info structure",&local_1a1);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    local_1a2 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_1b0 = (void *)0x0;
  local_1b8 = (void *)0x0;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_120,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
    if (local_1b0 != (void *)0x0) {
      operator_delete__(local_1b0);
    }
    if (local_1b8 != (void *)0x0) {
      operator_delete__(local_1b8);
    }
    png_destroy_read_struct(&local_120,&local_150,&local_180);
    fclose(local_b0);
    local_21a = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,local_18,&local_219);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (char *)in_stack_fffffffffffffb60);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    local_21a = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  png_init_io(local_120,local_b0);
  png_read_info(local_120,local_150);
  uVar5 = png_get_image_width(local_120,local_150);
  local_228 = (ulong)uVar5;
  uVar5 = png_get_image_height(local_120,local_150);
  local_230 = (ulong)uVar5;
  local_234 = 1;
  bVar2 = png_get_color_type(local_120,local_150);
  local_238 = (uint)bVar2;
  if (((local_238 == 3) || (local_238 == 2)) || (local_238 == 6)) {
    local_234 = 3;
  }
  if ((long)in_stack_00000008 < 0) {
    in_stack_00000008 = (long)(local_228 + (long)local_1c + -1) / (long)local_1c;
  }
  if ((long)in_stack_00000010 < 0) {
    in_stack_00000010 = (long)(local_230 + (long)local_1c + -1) / (long)local_1c;
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (in_stack_fffffffffffffbc0,CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8)
             ,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::clear(in_stack_fffffffffffffb80);
  if (local_238 == 3) {
    png_set_palette_to_rgb(local_120);
  }
  bVar2 = png_get_bit_depth(local_120,local_150);
  local_23c = (uint)bVar2;
  if ((local_238 == 0) && (local_23c < 8)) {
    png_set_expand_gray_1_2_4_to_8(local_120);
  }
  if ((local_238 & 4) != 0) {
    png_set_strip_alpha(local_120);
  }
  local_240 = png_get_rowbytes(local_120,local_150);
  uVar6 = local_230 * (long)local_240;
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_1b0 = operator_new__(uVar6);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_230;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_1b8 = operator_new__(uVar6);
  for (local_244 = 0; (long)local_244 < (long)local_230; local_244 = local_244 + 1) {
    *(long *)((long)local_1b8 + (long)local_244 * 8) =
         (long)local_1b0 + (long)(local_244 * local_240);
  }
  png_read_image(local_120,local_1b8);
  if (((local_1c < 2) && (local_28 == 0)) &&
     ((local_30 == 0 && ((in_stack_00000008 == local_228 && (in_stack_00000010 == local_230)))))) {
    for (local_340 = 0; local_340 < (long)local_230; local_340 = local_340 + 1) {
      local_344 = 0;
      for (local_350 = 0; local_350 < (long)local_228; local_350 = local_350 + 1) {
        for (local_354 = 0; local_354 < local_234; local_354 = local_354 + 1) {
          if ((int)local_23c < 0x10) {
            local_356 = (store_t_conflict1)
                        *(byte *)(*(long *)((long)local_1b8 + local_340 * 8) + (long)local_344);
            local_344 = local_344 + 1;
          }
          else {
            local_356 = CONCAT11(*(undefined1 *)
                                  (*(long *)((long)local_1b8 + local_340 * 8) + (long)local_344),
                                 *(undefined1 *)
                                  (*(long *)((long)local_1b8 + local_340 * 8) +
                                  (long)(local_344 + 1)));
            local_344 = local_344 + 2;
          }
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                    (local_10,local_350,local_340,local_354,local_356);
        }
      }
    }
  }
  else {
    local_25c = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffffb70,
               (int *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (size_t)in_stack_fffffffffffffb60);
    local_274 = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffffb70,
               (int *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (size_t)in_stack_fffffffffffffb60);
    local_288[1] = 0;
    local_288[0] = local_30 * local_1c;
    plVar8 = std::max<long>(local_288 + 1,local_288);
    local_278 = (int)*plVar8;
    local_2a0[1] = 0;
    local_2a0[0] = -local_30;
    plVar8 = std::max<long>(local_2a0 + 1,local_2a0);
    for (local_2a0[2] = *plVar8;
        local_2a0[2] < (long)in_stack_00000010 &&
        (local_30 + local_2a0[2]) * (long)local_1c < (long)local_230;
        local_2a0[2] = local_2a0[2] + 1) {
      local_2a4 = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_2a8 = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_2b0 = 0;
      while( true ) {
        bVar3 = false;
        if (local_2b0 < local_1c) {
          bVar3 = local_2b0 + (local_30 + local_2a0[2]) * (long)local_1c < (long)local_230;
        }
        if (!bVar3) break;
        local_2c0 = 0;
        plVar8 = std::max<long>(&local_2c0,&local_28);
        local_2b4 = (int)*plVar8 * local_1c * local_234;
        local_2d8[1] = 0;
        local_2d8[0] = -local_28;
        plVar8 = std::max<long>(local_2d8 + 1,local_2d8);
        local_2d8[2] = *plVar8 * (long)local_234;
        local_2f0[1] = 0;
        local_2f0[0] = -local_28;
        plVar8 = std::max<long>(local_2f0 + 1,local_2f0);
        for (local_2f0[2] = *plVar8;
            local_2f0[2] < (long)in_stack_00000008 &&
            (local_28 + local_2f0[2]) * (long)local_1c < (long)local_228;
            local_2f0[2] = local_2f0[2] + 1) {
          local_2f4 = 0;
          while( true ) {
            bVar3 = false;
            if (local_2f4 < local_1c) {
              bVar3 = (local_28 + local_2f0[2]) * (long)local_1c + (long)local_2f4 < (long)local_228
              ;
            }
            if (!bVar3) break;
            for (local_2f8 = 0; local_2f8 < local_234; local_2f8 = local_2f8 + 1) {
              if ((int)local_23c < 0x10) {
                local_2fa = (ushort)*(byte *)(*(long *)((long)local_1b8 + (long)local_278 * 8) +
                                             (long)local_2b4);
                local_2b4 = local_2b4 + 1;
              }
              else {
                local_2fa = CONCAT11(*(undefined1 *)
                                      (*(long *)((long)local_1b8 + (long)local_278 * 8) +
                                      (long)local_2b4),
                                     *(undefined1 *)
                                      (*(long *)((long)local_1b8 + (long)local_278 * 8) +
                                      (long)(local_2b4 + 1)));
                local_2b4 = local_2b4 + 2;
              }
              bVar3 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValidS
                                (in_stack_fffffffffffffb60,
                                 (store_t_conflict1)((ulong)in_stack_fffffffffffffb58 >> 0x30));
              if (bVar3) {
                uVar5 = (uint)local_2fa;
                piVar9 = std::valarray<int>::operator[](&local_258,local_2d8[2] + local_2f8);
                *piVar9 = *piVar9 + uVar5;
                piVar9 = std::valarray<int>::operator[](&local_270,local_2d8[2] + local_2f8);
                *piVar9 = *piVar9 + 1;
              }
            }
            local_2f4 = local_2f4 + 1;
          }
          local_2d8[2] = local_234 + local_2d8[2];
        }
        local_278 = local_278 + 1;
        local_2b0 = local_2b0 + 1;
      }
      local_318[1] = 0;
      local_318[0] = -local_28;
      plVar8 = std::max<long>(local_318 + 1,local_318);
      local_318[2] = *plVar8 * (long)local_234;
      local_330[1] = 0;
      local_330[0] = -local_28;
      plVar8 = std::max<long>(local_330 + 1,local_330);
      for (local_330[2] = *plVar8;
          local_330[2] < (long)in_stack_00000008 &&
          (local_28 + local_330[2]) * (long)local_1c < (long)local_228;
          local_330[2] = local_330[2] + 1) {
        for (local_334 = 0; local_334 < local_234; local_334 = local_334 + 1) {
          piVar9 = std::valarray<int>::operator[](&local_270,local_318[2]);
          this_00 = local_10;
          i_00 = local_330[2];
          if (0 < *piVar9) {
            k_00 = local_2a0[2];
            j_00 = local_334;
            piVar9 = std::valarray<int>::operator[](&local_258,local_318[2]);
            iVar4 = *piVar9;
            piVar9 = std::valarray<int>::operator[](&local_270,local_318[2]);
            iVar4 = iVar4 + *piVar9 / 2;
            piVar9 = std::valarray<int>::operator[](&local_270,local_318[2]);
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                      (this_00,i_00,k_00,j_00,(ushort)(iVar4 / *piVar9) & 0xff);
          }
          local_318[2] = local_318[2] + 1;
        }
      }
    }
    std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffb60);
    std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffb60);
  }
  if (local_1b8 != (void *)0x0) {
    operator_delete__(local_1b8);
  }
  if (local_1b0 != (void *)0x0) {
    operator_delete__(local_1b0);
  }
  png_destroy_read_struct(&local_120,&local_150,&local_180);
  fclose(local_b0);
  return;
}

Assistant:

void PNGImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  int bits=png_get_bit_depth(png, info);

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU16::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              if (bits < 16)
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]);
                jj++;
              }
              else
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]<<8) | row[rk][jj+1];
                jj+=2;
              }

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          ImageU16::store_t v;

          if (bits < 16)
          {
            v=static_cast<ImageU16::store_t>(row[k][j]);
            j++;
          }
          else
          {
            v=static_cast<ImageU16::store_t>(row[k][j]<<8) | row[k][j+1];
            j+=2;
          }

          image.set(i, k, d, v);
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}